

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_get_table(sqlite3 *db,char *zSql,char ***pazResult,int *pnRow,int *pnColumn,
                     char **pzErrMsg)

{
  sqlite3 *psVar1;
  int iVar2;
  char *pcVar3;
  ulong *puVar4;
  ulong *local_60;
  void *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  int local_40;
  sqlite3 *local_38;
  
  *pazResult = (char **)0x0;
  if (pnColumn != (int *)0x0) {
    *pnColumn = 0;
  }
  if (pnRow != (int *)0x0) {
    *pnRow = 0;
  }
  if (pzErrMsg != (char **)0x0) {
    *pzErrMsg = (char *)0x0;
  }
  local_58 = (void *)0x0;
  local_50 = 0x14;
  uStack_48 = 0x100000000;
  local_40 = 0;
  iVar2 = sqlite3_initialize();
  if ((iVar2 == 0) && (local_60 = (ulong *)sqlite3Malloc(0xa0), local_60 != (ulong *)0x0)) {
    *local_60 = 0;
    local_38 = db;
    iVar2 = sqlite3_exec(db,zSql,sqlite3_get_table_cb,&local_60,pzErrMsg);
    *local_60 = uStack_48 >> 0x20;
    if ((char)iVar2 == '\x04') {
      sqlite3_free_table((char **)(local_60 + 1));
      psVar1 = local_38;
      if (local_58 != (void *)0x0) {
        if (pzErrMsg != (char **)0x0) {
          sqlite3_free(*pzErrMsg);
          pcVar3 = sqlite3_mprintf("%s",local_58);
          *pzErrMsg = pcVar3;
        }
        sqlite3_free(local_58);
      }
      psVar1->errCode = local_40;
      return local_40;
    }
    sqlite3_free(local_58);
    if (iVar2 != 0) {
      sqlite3_free_table((char **)(local_60 + 1));
      return iVar2;
    }
    puVar4 = local_60;
    if (((uint)local_50 <= uStack_48._4_4_) ||
       (puVar4 = (ulong *)sqlite3Realloc(local_60,(ulong)uStack_48._4_4_ << 3),
       puVar4 != (ulong *)0x0)) {
      *pazResult = (char **)(puVar4 + 1);
      if (pnColumn != (int *)0x0) {
        *pnColumn = (int)uStack_48;
      }
      if (pnRow == (int *)0x0) {
        return 0;
      }
      *pnRow = local_50._4_4_;
      return 0;
    }
    sqlite3_free_table((char **)(local_60 + 1));
    local_38->errCode = 7;
  }
  else {
    db->errCode = 7;
  }
  return 7;
}

Assistant:

SQLITE_API int sqlite3_get_table(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  char ***pazResult,          /* Write the result table here */
  int *pnRow,                 /* Write the number of rows in the result here */
  int *pnColumn,              /* Write the number of columns of result here */
  char **pzErrMsg             /* Write error messages here */
){
  int rc;
  TabResult res;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pazResult==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *pazResult = 0;
  if( pnColumn ) *pnColumn = 0;
  if( pnRow ) *pnRow = 0;
  if( pzErrMsg ) *pzErrMsg = 0;
  res.zErrMsg = 0;
  res.nRow = 0;
  res.nColumn = 0;
  res.nData = 1;
  res.nAlloc = 20;
  res.rc = SQLITE_OK;
  res.azResult = sqlite3_malloc64(sizeof(char*)*res.nAlloc );
  if( res.azResult==0 ){
     db->errCode = SQLITE_NOMEM;
     return SQLITE_NOMEM_BKPT;
  }
  res.azResult[0] = 0;
  rc = sqlite3_exec(db, zSql, sqlite3_get_table_cb, &res, pzErrMsg);
  assert( sizeof(res.azResult[0])>= sizeof(res.nData) );
  res.azResult[0] = SQLITE_INT_TO_PTR(res.nData);
  if( (rc&0xff)==SQLITE_ABORT ){
    sqlite3_free_table(&res.azResult[1]);
    if( res.zErrMsg ){
      if( pzErrMsg ){
        sqlite3_free(*pzErrMsg);
        *pzErrMsg = sqlite3_mprintf("%s",res.zErrMsg);
      }
      sqlite3_free(res.zErrMsg);
    }
    db->errCode = res.rc;  /* Assume 32-bit assignment is atomic */
    return res.rc;
  }
  sqlite3_free(res.zErrMsg);
  if( rc!=SQLITE_OK ){
    sqlite3_free_table(&res.azResult[1]);
    return rc;
  }
  if( res.nAlloc>res.nData ){
    char **azNew;
    azNew = sqlite3Realloc( res.azResult, sizeof(char*)*res.nData );
    if( azNew==0 ){
      sqlite3_free_table(&res.azResult[1]);
      db->errCode = SQLITE_NOMEM;
      return SQLITE_NOMEM_BKPT;
    }
    res.azResult = azNew;
  }
  *pazResult = &res.azResult[1];
  if( pnColumn ) *pnColumn = res.nColumn;
  if( pnRow ) *pnRow = res.nRow;
  return rc;
}